

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggasolver.cpp
# Opt level: O0

int __thiscall GGASolver::findHeadChanges(GGASolver *this)

{
  double dVar1;
  double dVar2;
  MatrixSolver *pMVar3;
  reference pvVar4;
  Node *pNVar5;
  reference pvVar6;
  int local_28;
  int i;
  int errorCode;
  double *h;
  GGASolver *this_local;
  
  setMatrixCoeffs(this);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->dH,0);
  pMVar3 = (this->super_HydSolver).matrixSolver;
  this_local._4_4_ = (*pMVar3->_vptr_MatrixSolver[0xc])(pMVar3,(ulong)(uint)this->nodeCount,pvVar4);
  if (this_local._4_4_ < 0) {
    for (local_28 = 0; local_28 < this->nodeCount; local_28 = local_28 + 1) {
      dVar1 = pvVar4[local_28];
      pNVar5 = Network::node((this->super_HydSolver).network,local_28);
      dVar2 = pNVar5->head;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->dH,(long)local_28);
      *pvVar6 = dVar1 - dVar2;
    }
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int GGASolver::findHeadChanges()
{
    // ... setup the coeff. matrix of the GGA linearized system

    setMatrixCoeffs();

    // ... temporarily use the head change array dH[] to store new heads

    double *h = &dH[0];

    // ... solve the linearized GGA system for new nodal heads
    //     (matrixSolver returns a negative integer if it runs successfully;
    //      otherwise it returns the index of the row that caused it to fail.)

    int errorCode = matrixSolver->solve(nodeCount, h);
    if ( errorCode >= 0 ) return errorCode;

    // ... save new heads as head changes

    for (int i = 0; i < nodeCount; i++)
    {
        dH[i] = h[i] - network->node(i)->head;
    }

    // ... return a negative number indicating that
    //     the matrix solver ran successfully

     return -1;
}